

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O3

void __thiscall
burst::k_ary_search_set<int,std::less<void>>::initialize<boost::iterator_range<int_const*>>
          (k_ary_search_set<int,std::less<void>> *this,iterator_range<const_int_*> *range)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  ulong uVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int iVar8;
  const_iterator __cbeg;
  value_container_type buffer;
  int *local_40;
  int *local_38;
  long local_30;
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_28;
  
  piVar7 = (range->
           super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
           super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
           m_Begin;
  piVar5 = (range->
           super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
           super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
           m_End;
  piVar3 = piVar7;
  if (piVar7 == piVar5) {
LAB_001ace6f:
    initialize_trusted<boost::iterator_range<int_const*>>(this,range);
    return;
  }
  do {
    piVar6 = piVar3 + 1;
    if (piVar6 == piVar5) goto LAB_001ace6f;
    iVar8 = *piVar3;
    piVar3 = piVar6;
  } while (iVar8 < *piVar6);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_40,piVar7,piVar5,(allocator_type *)&local_28)
  ;
  piVar5 = local_38;
  piVar7 = local_40;
  if (local_40 != local_38) {
    uVar4 = (long)local_38 - (long)local_40 >> 2;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
              (local_40,local_38,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
              (piVar7,piVar5);
  }
  if (local_40 != local_38) {
    piVar7 = local_40 + 1;
    do {
      piVar5 = piVar7;
      if (piVar5 == local_38) goto LAB_001ace94;
      iVar8 = piVar5[-1];
      piVar7 = piVar5 + 1;
    } while (iVar8 < *piVar5);
    piVar5 = piVar5 + -1;
    for (; piVar7 != local_38; piVar7 = piVar7 + 1) {
      iVar1 = *piVar7;
      if (iVar8 < iVar1) {
        piVar5[1] = iVar1;
        piVar5 = piVar5 + 1;
        iVar8 = iVar1;
      }
    }
    if (piVar5 + 1 != local_38) {
      local_38 = piVar5 + 1;
    }
  }
LAB_001ace94:
  local_28.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_40;
  local_28.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_38;
  initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (this,&local_28);
  if (local_40 != (int *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  return;
}

Assistant:

void initialize (const RandomAccessRange & range)
        {
            const auto is_sorted_and_unique =
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end();
            if (is_sorted_and_unique)
            {
                initialize_trusted(range);
            }
            else
            {
                value_container_type buffer(range.begin(), range.end());
                std::sort(buffer.begin(), buffer.end(), m_compare);
                buffer.erase
                (
                    std::unique(buffer.begin(), buffer.end(), burst::not_fn(m_compare)),
                    buffer.end()
                );

                initialize_trusted(boost::make_iterator_range(buffer));
            }
        }